

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloatExpanded
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference)

{
  bool bVar1;
  qpTestResult qVar2;
  GLint64 GVar3;
  GLint64 GVar4;
  long *plVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  Hex<16UL> local_1f0;
  Hex<16UL> local_1e8;
  Hex<16UL> local_1e0 [3];
  MessageBuilder local_1c8;
  undefined1 local_48 [8];
  StateQueryMemoryWriteGuard<long> state;
  GLint64 expectedGLStateMin;
  GLint64 expectedGLStateMax;
  GLfloat reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  GVar3 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference);
  GVar4 = FloatStateQueryVerifiers::anon_unknown_0::expandGLFloatToInteger(reference);
  state.m_postguard = GVar4 + -0x7ff;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long> *)local_48);
  plVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::operator&
                     ((StateQueryMemoryWriteGuard<long> *)local_48);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,plVar5);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long> *)local_48,testCtx);
  if ((bVar1) &&
     ((plVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                          ((StateQueryMemoryWriteGuard *)local_48), *plVar5 < state.m_postguard ||
      (plVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                          ((StateQueryMemoryWriteGuard *)local_48), GVar3 + 0x7ff < *plVar5)))) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1c8,(char (*) [30])"// ERROR: expected in range [");
    local_1e0[0] = tcu::toHex<long>(state.m_postguard);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1e0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c5c975);
    local_1e8 = tcu::toHex<long>(GVar3 + 0x7ff);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"]; got ");
    plVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                       ((StateQueryMemoryWriteGuard *)local_48);
    local_1f0 = tcu::toHex<long>(*plVar5);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f0);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloatExpanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference)
{
	DE_ASSERT(de::inRange(reference, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint64 expectedGLStateMax = expandGLFloatToInteger(reference) + FLOAT_EXPANSION_E_64;
	const GLint64 expectedGLStateMin = expandGLFloatToInteger(reference) - FLOAT_EXPANSION_E_64;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state < expectedGLStateMin || state > expectedGLStateMax)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected in range [" << toHex(expectedGLStateMin) << "," << toHex(expectedGLStateMax) << "]; got " << toHex((GLint64)state) << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}